

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O3

void __thiscall NaStateSpaceModel::NaStateSpaceModel(NaStateSpaceModel *this)

{
  NaReal *pNVar1;
  
  NaUnit::NaUnit(&this->super_NaUnit,1,1,0);
  NaConfigPart::NaConfigPart(&this->super_NaConfigPart,"StateSpaceModel");
  (this->super_NaUnit).super_NaLogging._vptr_NaLogging = (_func_int **)&PTR_PrintLog_00178590;
  (this->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaStateSpaceModel_00178680;
  this->n = 1;
  this->m = 1;
  this->k = 1;
  NaMatrix::NaMatrix(&this->A,1,1);
  NaMatrix::NaMatrix(&this->B,1,1);
  NaMatrix::NaMatrix(&this->C,1,1);
  NaMatrix::NaMatrix(&this->D,1,1);
  NaVector::NaVector(&this->x,1);
  NaVector::NaVector(&this->x0,0);
  pNVar1 = NaMatrix::fetch(&this->A,0,0);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(&this->B,0,0);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(&this->C,0,0);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(&this->D,0,0);
  *pNVar1 = 0.0;
  return;
}

Assistant:

NaStateSpaceModel::NaStateSpaceModel ()
    : NaUnit(1, 1),
      A(1, 1), B(1, 1), C(1, 1), D(1, 1), x(1), x0(0),
      n(1), m(1), k(1),
      NaConfigPart(NaTYPE_StateSpaceModel)
{
    A.fetch(0,0) = 0.0;
    B.fetch(0,0) = 0.0;
    C.fetch(0,0) = 0.0;
    D.fetch(0,0) = 0.0;
}